

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O3

QString * __thiscall
anon_unknown.dwarf_14cf1db::errorMessageForSyscall
          (QString *__return_storage_ptr__,anon_unknown_dwarf_14cf1db *this,QUtf8StringView fnName,
          int errnoCode)

{
  long in_FS_OFFSET;
  QString local_50;
  QString local_38;
  QBasicUtf8StringView<false> local_20;
  QString *local_10;
  
  local_20.m_size = (qsizetype)fnName.m_data;
  local_10 = *(QString **)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.m_data = (storage_type *)this;
  qt_error_string(&local_38,(int)fnName.m_size);
  QMetaObject::tr(&local_50,&QProcess::staticMetaObject,"Child process set up failed: %1: %2",
                  (char *)0x0,-1);
  QString::arg<QBasicUtf8StringView<false>&,QString>
            (__return_storage_ptr__,&local_50,&local_20,&local_38);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(QString **)(in_FS_OFFSET + 0x28) == local_10) {
    return *(QString **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QString errorMessageForSyscall(QUtf8StringView fnName, int errnoCode = -1)
{
    QString msg = qt_error_string(errnoCode);
    return QProcess::tr("Child process set up failed: %1: %2").arg(fnName, std::move(msg));
}